

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

char __thiscall absl::lts_20250127::Cord::operator[](Cord *this,size_t i)

{
  bool bVar1;
  char cVar2;
  size_t sVar3;
  Nullable<absl::cord_internal::CordRep_*> rep_00;
  Nullable<const_char_*> pcVar4;
  CordRepFlat *this_00;
  char *pcVar5;
  CordRepBtree *this_01;
  CordRepExternal *pCVar6;
  CordRepSubstring *pCVar7;
  CordRep *local_38;
  CordRep *rep;
  size_t offset;
  CordRep *local_20;
  size_t i_local;
  Cord *this_local;
  
  local_20 = (CordRep *)i;
  i_local = (size_t)this;
  sVar3 = size(this);
  if (sVar3 <= i) {
    operator[]::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)((long)&offset + 7));
  }
  rep = local_20;
  rep_00 = InlineRep::tree(&this->contents_);
  if (rep_00 == (Nullable<absl::cord_internal::CordRep_*>)0x0) {
    pcVar4 = InlineRep::data(&this->contents_);
    this_local._7_1_ = pcVar4[(long)local_20];
  }
  else {
    local_38 = cord_internal::SkipCrcNode(rep_00);
    while( true ) {
      if (local_38 == (CordRep *)0x0) {
        __assert_fail("rep != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
                      ,0x48d,"char absl::Cord::operator[](size_t) const");
      }
      if ((CordRep *)local_38->length <= rep) {
        __assert_fail("offset < rep->length",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
                      ,0x48e,"char absl::Cord::operator[](size_t) const");
      }
      bVar1 = cord_internal::CordRep::IsFlat(local_38);
      if (bVar1) break;
      bVar1 = cord_internal::CordRep::IsBtree(local_38);
      if (bVar1) {
        this_01 = cord_internal::CordRep::btree(local_38);
        cVar2 = cord_internal::CordRepBtree::GetCharacter(this_01,(size_t)rep);
        return cVar2;
      }
      bVar1 = cord_internal::CordRep::IsExternal(local_38);
      if (bVar1) {
        pCVar6 = cord_internal::CordRep::external(local_38);
        return pCVar6->base[(long)rep];
      }
      bVar1 = cord_internal::CordRep::IsSubstring(local_38);
      if (!bVar1) {
        __assert_fail("rep->IsSubstring()",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
                      ,0x499,"char absl::Cord::operator[](size_t) const");
      }
      pCVar7 = cord_internal::CordRep::substring(local_38);
      rep = (CordRep *)(rep->storage + (pCVar7->start - 0xd));
      pCVar7 = cord_internal::CordRep::substring(local_38);
      local_38 = pCVar7->child;
    }
    this_00 = cord_internal::CordRep::flat(local_38);
    pcVar5 = cord_internal::CordRepFlat::Data(this_00);
    this_local._7_1_ = pcVar5[(long)rep];
  }
  return this_local._7_1_;
}

Assistant:

char Cord::operator[](size_t i) const {
  ABSL_HARDENING_ASSERT(i < size());
  size_t offset = i;
  const CordRep* rep = contents_.tree();
  if (rep == nullptr) {
    return contents_.data()[i];
  }
  rep = cord_internal::SkipCrcNode(rep);
  while (true) {
    assert(rep != nullptr);
    assert(offset < rep->length);
    if (rep->IsFlat()) {
      // Get the "i"th character directly from the flat array.
      return rep->flat()->Data()[offset];
    } else if (rep->IsBtree()) {
      return rep->btree()->GetCharacter(offset);
    } else if (rep->IsExternal()) {
      // Get the "i"th character from the external array.
      return rep->external()->base[offset];
    } else {
      // This must be a substring a node, so bypass it to get to the child.
      assert(rep->IsSubstring());
      offset += rep->substring()->start;
      rep = rep->substring()->child;
    }
  }
}